

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_PlayerSelectedWeapon(FParser *this)

{
  undefined8 *puVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  PClassActor *type;
  AInventory *pAVar5;
  long lVar6;
  char **ppcVar7;
  char *s;
  int i;
  long lVar8;
  
  if (this->t_argc < 1) {
    script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
    return;
  }
  iVar2 = T_GetPlayerNum(this->t_argv);
  if (this->t_argc == 2) {
    uVar3 = intvalue(this->t_argv + 1);
    if (uVar3 < 9) {
      type = PClass::FindActor(SF_PlayerWeapon::WeaponNames[uVar3]);
      if (type != (PClassActor *)0x0) {
        pAVar5 = AActor::FindInventory((AActor *)(&players)[(long)iVar2 * 0x54],type,false);
        *(AInventory **)(&DAT_00a60368 + (long)iVar2 * 0x2a0) = pAVar5;
        goto LAB_006aab42;
      }
      s = "incompatibility in playerweapon\n";
    }
    else {
      s = "weaponnum out of range! %s\n";
    }
    script_error(s,(ulong)uVar3);
    return;
  }
LAB_006aab42:
  (this->t_return).type = 1;
  ppcVar7 = SF_PlayerWeapon::WeaponNames;
  lVar8 = 0;
  while( true ) {
    puVar1 = *(undefined8 **)(&DAT_00a60360 + (long)iVar2 * 0x2a0);
    lVar6 = puVar1[1];
    if (lVar6 == 0) {
      lVar6 = (**(code **)*puVar1)(puVar1);
      puVar1[1] = lVar6;
    }
    iVar4 = FName::NameManager::FindName(&FName::NameData,*ppcVar7,false);
    if (*(int *)(lVar6 + 0x88) == iVar4) break;
    lVar8 = lVar8 + 1;
    ppcVar7 = ppcVar7 + 1;
    if (lVar8 == 9) {
      return;
    }
  }
  (this->t_return).value.i = (int)lVar8;
  return;
}

Assistant:

void FParser::SF_PlayerSelectedWeapon()
{
	int playernum;
	int weaponnum;


	static const char * const WeaponNames[]={
		"Fist", "Pistol", "Shotgun", "Chaingun", "RocketLauncher", 
		"PlasmaRifle", "BFG9000", "Chainsaw", "SuperShotgun" };


	if (CheckArgs(1))
	{
		playernum=T_GetPlayerNum(t_argv[0]);

		if(t_argc == 2)
		{
			weaponnum = intvalue(t_argv[1]);

			if (weaponnum<0 || weaponnum>=9)
			{
				script_error("weaponnum out of range! %s\n", weaponnum);
				return;
			}
			PClassWeapon * ti = static_cast<PClassWeapon *>(PClass::FindActor(WeaponNames[weaponnum]));
			if (!ti)
			{
				script_error("incompatibility in playerweapon\n", weaponnum);
				return;
			}

			players[playernum].PendingWeapon = (AWeapon*)players[playernum].mo->FindInventory(ti);

		} 
		t_return.type = svt_int;
		for(int i=0;i<9;i++)
		{
			if (players[playernum].ReadyWeapon->GetClass ()->TypeName == FName(WeaponNames[i]))
			{
				t_return.value.i=i;
				break;
			}
		}
	}
}